

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

bool goodform::json::parse_array(istream *input,any *v)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  vector<std::any,_std::allocator<std::any>_> *this;
  byte bVar4;
  any elem;
  vector<std::any,_std::allocator<std::any>_> local_48;
  
  local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::any::operator=(v,&local_48);
  std::vector<std::any,_std::allocator<std::any>_>::~vector(&local_48);
  cVar1 = std::istream::get();
  if (cVar1 == '[') {
    do {
      if (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) != 0) goto LAB_00130c01;
      strip_white_space(input);
      iVar3 = std::istream::peek();
      if (iVar3 == 0x5d) {
        std::istream::seekg((long)input,_S_cur);
        return true;
      }
      local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar2 = deserialize(input,(any *)&local_48);
      this = get<std::vector<std::any,std::allocator<std::any>>>(v);
      std::vector<std::any,_std::allocator<std::any>_>::emplace_back<std::any>
                (this,(any *)&local_48);
      bVar4 = 1;
      if (bVar2) {
        strip_white_space(input);
        iVar3 = std::istream::peek();
        iVar3 = iVar3 << 0x18;
        if ((iVar3 != 0x5d000000) && (iVar3 != 0x2c000000)) goto LAB_00130bdb;
        bVar2 = iVar3 == 0x5d000000;
        std::istream::seekg((long)input,_S_cur);
        bVar4 = 0;
      }
      else {
LAB_00130bdb:
        bVar2 = false;
      }
      if (local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                  super__Vector_impl_data._M_start)(3,&local_48,0);
      }
    } while ((bVar4 | bVar2) != 1);
  }
  else {
LAB_00130c01:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool json::parse_array(std::istream& input, any& v)
  {
    v = goodform::array_t();
    char c = (char)input.get();
    bool closingBraceFound = false;
    if (c == '[')
    {
      bool parseError = false;
      while(!closingBraceFound && !parseError && input.good())
      {
        strip_white_space(input);
        if ((closingBraceFound = (input.peek() == ']')))
        {
          input.seekg(1, std::ios::cur);
        }
        else
        {
          any elem;
          parseError = !deserialize(input, elem);
          get<goodform::array_t>(v).push_back(std::move(elem));
          if (!parseError)
          {
            strip_white_space(input);
            c = (char)input.peek();
            if ((closingBraceFound = (c == ']')) || !(parseError = (c != ',')))
              input.seekg(1, std::ios::cur);
          }
        }
      }
    }
    return closingBraceFound;
  }